

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O3

void fejer2_compute(int n,double *x,double *w)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FEJER2_COMPUTE - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  N < 1.\n");
    exit(1);
  }
  uVar1 = (ulong)(uint)n;
  if (n == 2) {
    *x = -0.5;
    x[1] = 0.5;
    *w = 1.0;
    w[1] = 1.0;
  }
  else {
    if (n != 1) {
      pvVar2 = operator_new__(uVar1 * 8);
      dVar13 = (double)(int)(n + 1U);
      uVar3 = 0;
      uVar5 = uVar1;
      do {
        *(double *)((long)pvVar2 + uVar3 * 8) = ((double)(int)uVar5 * 3.141592653589793) / dVar13;
        uVar5 = (ulong)((int)uVar5 - 1);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      uVar5 = 0;
      do {
        dVar9 = cos(*(double *)((long)pvVar2 + uVar5 * 8));
        x[uVar5] = dVar9;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
      dVar9 = (double)(n + 1U >> 1);
      dVar9 = dVar9 + dVar9 + -1.0;
      uVar5 = 0;
      do {
        dVar12 = *(double *)((long)pvVar2 + uVar5 * 8);
        dVar10 = 1.0;
        if (2 < (uint)n) {
          iVar7 = 4;
          uVar6 = 2;
          dVar10 = 1.0;
          uVar4 = 1;
          do {
            dVar11 = cos((double)uVar6 * dVar12);
            dVar10 = dVar10 - (dVar11 + dVar11) / (double)(int)(iVar7 * uVar4 + -1);
            w[uVar5] = dVar10;
            iVar7 = iVar7 + 4;
            uVar6 = uVar6 + 2;
            bVar8 = uVar4 != n - 1U >> 1;
            uVar4 = uVar4 + 1;
          } while (bVar8);
        }
        dVar12 = cos(dVar12 * (dVar9 + 1.0));
        w[uVar5] = dVar10 - dVar12 / dVar9;
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar1);
      uVar5 = 0;
      do {
        w[uVar5] = (w[uVar5] + w[uVar5]) / dVar13;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
      operator_delete__(pvVar2);
      return;
    }
    *x = 0.0;
    *w = 2.0;
  }
  return;
}

Assistant:

void fejer2_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEJER2_COMPUTE computes a Fejer type 2 quadrature rule.
//
//  Discussion:
//
//    This method uses a direct approach.
//
//    Thanks to Mike Neish, University of Toronto, for pointing out a
//    memory leak in a previous version of this code, 13 October 2009.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//    Walter Gautschi,
//    Numerical Quadrature in the Presence of a Singularity,
//    SIAM Journal on Numerical Analysis,
//    Volume 4, Number 3, 1967, pages 357-362.
//
//    Joerg Waldvogel,
//    Fast Construction of the Fejer and Clenshaw-Curtis Quadrature Rules,
//    BIT Numerical Mathematics,
//    Volume 43, Number 1, 2003, pages 1-18.
//
//  Parameters:
//
//    Input, int N, the order.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  int j;
  double p;
  const double r8_pi = 3.141592653589793;
  double *theta;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "FEJER2_COMPUTE - Fatal error!\n";
    std::cerr << "  N < 1.\n";
    exit ( 1 );
  }

  if ( n == 1 )
  {
    x[0] = 0.0;
    w[0] = 2.0;
    return;
  }
  else if ( n == 2 )
  {
    x[0] = -0.5;
    x[1] = +0.5;
    w[0] = 1.0;
    w[1] = 1.0;
    return;
  }

  theta = new double[n];

  for ( i = 1; i <= n; i++ )
  {
    theta[i-1] = double( n + 1 - i ) * r8_pi
               / double( n + 1     );
  }

  for ( i = 0; i < n; i++ )
  {
    x[i] = cos ( theta[i] );
  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 1.0;

    for ( j = 1; j <= ( ( n - 1 ) / 2 ); j++ )
    {
      w[i] = w[i] - 2.0 * cos ( 2.0 * double( j ) * theta[i] ) 
        / double( 4 * j * j - 1 );
    }

    if ( 2 < n )
    {
      p = 2.0 * double( ( n + 1 ) / 2 ) - 1.0;
      w[i] = w[i] - cos ( ( p + 1.0 ) * theta[i] ) / p;
    }

  }

  for ( i = 0; i < n; i++ )
  {
    w[i] = 2.0 * w[i] / double( n + 1 );
  }

  delete [] theta;

  return;
}